

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

uint __thiscall
ImGui::RoundScalarWithFormatT<unsigned_int,int>
          (ImGui *this,char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  ImGui IVar2;
  undefined1 auVar3 [16];
  ImGui *pIVar4;
  undefined4 in_register_0000000c;
  ImGui *pIVar5;
  int iVar6;
  uint uVar7;
  char *src;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  char fmt_sanitized [32];
  char v_str [64];
  uint local_7c;
  ImGui local_78 [31];
  char local_59;
  char local_58 [72];
  
  pIVar5 = (ImGui *)CONCAT44(in_register_0000000c,v);
  do {
    IVar2 = *this;
    if (IVar2 == (ImGui)0x0) {
      iVar6 = 3;
      pIVar4 = pIVar5;
    }
    else if ((IVar2 != (ImGui)0x25) || (iVar6 = 1, pIVar4 = this, this[1] == (ImGui)0x25)) {
      this = this + (ulong)(IVar2 == (ImGui)0x25) + 1;
      iVar6 = 0;
      pIVar4 = pIVar5;
    }
    pIVar5 = pIVar4;
  } while (iVar6 == 0);
  if (iVar6 == 1) {
    this = pIVar4;
  }
  if ((*this == (ImGui)0x25) && (this[1] != (ImGui)0x25)) {
    local_7c = data_type;
    pIVar4 = (ImGui *)ImParseFormatFindEnd((char *)this);
    pIVar5 = local_78;
    if (this < pIVar4) {
      do {
        uVar7 = (byte)*this - 0x24;
        if ((0x3b < uVar7) || ((0x800000000000009U >> ((ulong)uVar7 & 0x3f) & 1) == 0)) {
          *pIVar5 = *this;
          pIVar5 = pIVar5 + 1;
        }
        this = this + 1;
      } while (this != pIVar4);
    }
    *pIVar5 = (ImGui)0x0;
    ImFormatString(local_58,0x40,(char *)local_78,(ulong)local_7c);
    src = &local_59;
    do {
      pcVar1 = src + 1;
      src = src + 1;
    } while (*pcVar1 == ' ');
    if (((uint)format & 0xfffffffe) == 8) {
      dVar8 = atof(src);
      auVar3._8_8_ = extraout_XMM0_Qb;
      auVar3._0_8_ = dVar8;
      data_type = vcvttsd2usi_avx512f(auVar3);
    }
    else {
      ImAtoi<int>(src,(int *)&local_7c);
      data_type = local_7c;
    }
  }
  return data_type;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}